

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O2

char lejp_globals_cb(lejp_ctx *ctx,char reason)

{
  uint64_t *puVar1;
  uint8_t uVar2;
  jpargs *a;
  lws_context_creation_info *plVar3;
  int iVar4;
  uint uVar5;
  lws_protocol_vhost_options *plVar6;
  char *pcVar7;
  
  if ((reason & 0x40U) == 0) {
    return '\0';
  }
  uVar2 = ctx->path_match;
  if (uVar2 == '\0') {
    return '\0';
  }
  a = (jpargs *)ctx->user;
  if (uVar2 == '\v' && reason == 'M') {
    plVar6 = (lws_protocol_vhost_options *)lwsws_align(a);
    pcVar7 = a->p + 0x20;
    a->p = pcVar7;
    iVar4 = lejp_get_wildcard(ctx,0,pcVar7,*(int *)&a->end - (int)pcVar7);
    plVar3 = a->info;
    plVar6->next = plVar3->reject_service_keywords;
    plVar3->reject_service_keywords = plVar6;
    pcVar7 = a->p;
    plVar6->name = pcVar7;
    _lws_log(4,"  adding rej %s=%s\n",pcVar7,ctx->buf);
    pcVar7 = a->p;
    a->p = pcVar7 + iVar4;
    pcVar7[(long)iVar4 + -1] = '\0';
    pcVar7 = a->p;
    plVar6->value = pcVar7;
    plVar6->options = (lws_protocol_vhost_options *)0x0;
    goto LAB_00139941;
  }
  switch(uVar2) {
  case '\x01':
    iVar4 = atoi(ctx->buf);
    a->info->uid = iVar4;
    break;
  case '\x02':
    iVar4 = atoi(ctx->buf);
    a->info->gid = iVar4;
    break;
  case '\x03':
    pcVar7 = a->p;
    a->info->username = pcVar7;
    goto LAB_00139941;
  case '\x04':
    pcVar7 = a->p;
    a->info->groupname = pcVar7;
    goto LAB_00139941;
  case '\x05':
    uVar5 = atoi(ctx->buf);
    a->info->count_threads = uVar5;
    break;
  case '\x06':
    iVar4 = arg_to_bool(ctx->buf);
    if (iVar4 != 0) {
      puVar1 = &a->info->options;
      *puVar1 = *puVar1 | 0x1000;
    }
    break;
  case '\a':
    pcVar7 = a->p;
    a->info->server_string = pcVar7;
    goto LAB_00139941;
  case '\b':
    iVar4 = a->count_plugin_dirs;
    if ((long)iVar4 == 9) {
      _lws_log(1,"Too many plugin dirs\n");
      return -1;
    }
    pcVar7 = a->p;
    a->count_plugin_dirs = iVar4 + 1;
    a->plugin_dirs[iVar4] = pcVar7;
    goto LAB_00139941;
  case '\t':
    iVar4 = atoi(ctx->buf);
    a->info->ws_ping_pong_interval = (unsigned_short)iVar4;
    break;
  case '\n':
    uVar5 = atoi(ctx->buf);
    a->info->timeout_secs = uVar5;
    break;
  case '\r':
    pcVar7 = a->p;
    a->info->alpn = pcVar7;
LAB_00139941:
    iVar4 = lws_snprintf(pcVar7,(long)a->end - (long)pcVar7,"%s",ctx->buf);
    pcVar7 = a->p;
    a->p = pcVar7 + iVar4 + 1;
    pcVar7[iVar4] = '\0';
    return '\0';
  case '\x0e':
    iVar4 = atoi(ctx->buf);
    a->info->ip_limit_ah = (unsigned_short)iVar4;
    break;
  case '\x0f':
    iVar4 = atoi(ctx->buf);
    a->info->ip_limit_wsi = (unsigned_short)iVar4;
  }
  return '\0';
}

Assistant:

static signed char
lejp_globals_cb(struct lejp_ctx *ctx, char reason)
{
	struct jpargs *a = (struct jpargs *)ctx->user;
	struct lws_protocol_vhost_options *rej;
	int n;

	/* we only match on the prepared path strings */
	if (!(reason & LEJP_FLAG_CB_IS_VALUE) || !ctx->path_match)
		return 0;

	/* this catches, eg, vhosts[].headers[].xxx */
	if (reason == LEJPCB_VAL_STR_END &&
	    ctx->path_match == LWJPGP_REJECT_SERVICE_KEYWORDS_NAME + 1) {
		rej = lwsws_align(a);
		a->p += sizeof(*rej);

		n = lejp_get_wildcard(ctx, 0, a->p, lws_ptr_diff(a->end, a->p));
		rej->next = a->info->reject_service_keywords;
		a->info->reject_service_keywords = rej;
		rej->name = a->p;
		 lwsl_notice("  adding rej %s=%s\n", a->p, ctx->buf);
		a->p += n - 1;
		*(a->p++) = '\0';
		rej->value = a->p;
		rej->options = NULL;
		goto dostring;
	}

	switch (ctx->path_match - 1) {
	case LEJPGP_UID:
		a->info->uid = atoi(ctx->buf);
		return 0;
	case LEJPGP_GID:
		a->info->gid = atoi(ctx->buf);
		return 0;
	case LEJPGP_USERNAME:
		a->info->username = a->p;
		break;
	case LEJPGP_GROUPNAME:
		a->info->groupname = a->p;
		break;
	case LEJPGP_COUNT_THREADS:
		a->info->count_threads = atoi(ctx->buf);
		return 0;
	case LWJPGP_INIT_SSL:
		if (arg_to_bool(ctx->buf))
			a->info->options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
		return 0;
	case LEJPGP_SERVER_STRING:
#if defined(LWS_WITH_SERVER)
		a->info->server_string = a->p;
#endif
		break;
	case LEJPGP_PLUGIN_DIR:
		if (a->count_plugin_dirs == MAX_PLUGIN_DIRS - 1) {
			lwsl_err("Too many plugin dirs\n");
			return -1;
		}
		a->plugin_dirs[a->count_plugin_dirs++] = a->p;
		break;

	case LWJPGP_PINGPONG_SECS:
		a->info->ws_ping_pong_interval = atoi(ctx->buf);
		return 0;

	case LWJPGP_TIMEOUT_SECS:
		a->info->timeout_secs = atoi(ctx->buf);
		return 0;

	case LWJPGP_DEFAULT_ALPN:
		a->info->alpn = a->p;
		break;

	case LWJPGP_IP_LIMIT_AH:
		a->info->ip_limit_ah = atoi(ctx->buf);
		return 0;

	case LWJPGP_IP_LIMIT_WSI:
		a->info->ip_limit_wsi = atoi(ctx->buf);
		return 0;

	default:
		return 0;
	}

dostring:
	a->p += lws_snprintf(a->p, a->end - a->p, "%s", ctx->buf);
	*(a->p)++ = '\0';

	return 0;
}